

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O2

void test_ipv6(void)

{
  ostream *poVar1;
  endpoint ep;
  stream_socket s1;
  stream_socket s2;
  acceptor acc;
  error_code err;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing IPv6");
  std::endl<char,std::char_traits<char>>(poVar1);
  booster::aio::acceptor::acceptor(&acc);
  err._M_value = 0;
  err._M_cat = (error_category *)std::_V2::system_category();
  booster::aio::acceptor::open(&acc,2,&err);
  if (err._M_value == 0) {
    std::__cxx11::string::string((string *)&s1,"::1",(allocator *)&s2);
    booster::aio::endpoint::endpoint(&ep,(string *)&s1,0x1f90);
    std::__cxx11::string::~string((string *)&s1);
    booster::aio::acceptor::bind((endpoint *)&acc);
    booster::aio::acceptor::listen((int)&acc);
    booster::aio::stream_socket::stream_socket(&s1);
    booster::aio::stream_socket::stream_socket(&s2);
    booster::aio::stream_socket::open(&s1,2);
    booster::aio::stream_socket::connect((endpoint *)&s1);
    booster::aio::acceptor::accept((stream_socket *)&acc);
    test_connected(&s1,&s2);
    booster::aio::basic_io_device::close();
    booster::aio::basic_io_device::close();
    booster::aio::basic_io_device::close();
    booster::aio::stream_socket::~stream_socket(&s2);
    booster::aio::stream_socket::~stream_socket(&s1);
    booster::aio::endpoint::~endpoint(&ep);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "-- Looks like IPv6 is not supported on this host");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  booster::aio::acceptor::~acceptor(&acc);
  return;
}

Assistant:

void test_ipv6()
{
#if !defined(BOOSTER_AIO_NO_PF_INET6)
	std::cout << "Testing IPv6" << std::endl;
	io::acceptor acc;
	sys::error_code err;
	acc.open(io::pf_inet6,err);
	if(err) {
		std::cerr << "-- Looks like IPv6 is not supported on this host" << std::endl;
		return;
	}
	io::endpoint ep("::1",8080);
	acc.bind(ep);
	acc.listen(1);
	io::stream_socket s1;
	io::stream_socket s2;
	s1.open(io::pf_inet6);
	s1.connect(ep);
	acc.accept(s2);
	test_connected(s1,s2);
	s1.close();
	s2.close();
	acc.close();
#endif
}